

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PopPolicy(cmMakefile *this)

{
  bool bVar1;
  string local_38;
  
  bVar1 = cmState::Snapshot::PopPolicy(&this->StateSnapshot);
  if (!bVar1) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"cmake_policy POP without matching PUSH","");
    IssueMessage(this,FATAL_ERROR,&local_38,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmMakefile::PopPolicy()
{
  if (!this->StateSnapshot.PopPolicy())
    {
    this->IssueMessage(cmake::FATAL_ERROR,
                       "cmake_policy POP without matching PUSH");
    }
}